

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iprog.c
# Opt level: O0

void pulse_prog_cimar_babies(OBJ_DATA *obj,bool isTick)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  byte in_SIL;
  CHAR_DATA *in_RDI;
  CHAR_DATA *ch;
  CHAR_DATA *ch_00;
  undefined7 in_stack_fffffffffffffff0;
  
  bVar1 = in_SIL & 1;
  ch_00 = in_RDI->reply;
  if ((((ch_00 != (CHAR_DATA *)0x0) && (bVar2 = is_npc(ch_00), !bVar2)) &&
      (iVar3 = number_percent(), 0x62 < iVar3)) &&
     (bVar2 = is_affected_obj((OBJ_DATA *)in_RDI,(int)gsn_bash), !bVar2)) {
    act((char *)ch,in_RDI,(void *)CONCAT17(bVar1,in_stack_fffffffffffffff0),ch_00,0);
    act((char *)ch,in_RDI,(void *)CONCAT17(bVar1,in_stack_fffffffffffffff0),ch_00,0);
  }
  return;
}

Assistant:

void pulse_prog_cimar_babies(OBJ_DATA *obj, bool isTick)
{
	CHAR_DATA *ch = obj->carried_by;

	if (ch == nullptr || is_npc(ch))
		return;

	if (number_percent() <= 98 || is_affected_obj(obj, gsn_bash))
		return;

	act("$p begins wailing, its squalling face turning bright red.", ch, obj, 0, TO_CHAR);
	act("$n's baby begins wailing...", ch, obj, 0, TO_ROOM);
}